

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  ImDrawVert *pIVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  ImDrawVert *pIVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ImDrawVert *pIVar12;
  ulong uVar13;
  uint uVar14;
  long unaff_R14;
  ushort uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 in_register_00001208 [56];
  undefined1 in_register_00001248 [56];
  undefined1 auVar39 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM22 [64];
  
  auVar20._8_56_ = in_register_00001248;
  auVar20._0_8_ = gradient_p1;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = gradient_p0;
  if (vert_start_idx < vert_end_idx) {
    lVar7 = (long)vert_start_idx;
    pIVar1 = (draw_list->VtxBuffer).Data;
    auVar18 = auVar19._0_16_;
    auVar17 = vsubps_avx(auVar20._0_16_,auVar18);
    auVar19 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx512f(_DAT_00545d00);
    auVar22 = vpbroadcastd_avx512f(ZEXT416(0xff000000));
    auVar16 = vmovshdup_avx(auVar17);
    auVar23 = vbroadcastsd_avx512f(auVar16);
    pIVar12 = pIVar1 + lVar7;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * auVar16._0_4_)),auVar17,auVar17);
    auVar24 = vbroadcastss_avx512f(auVar17);
    pIVar8 = pIVar1 + vert_end_idx;
    if (pIVar1 + vert_end_idx < pIVar1 + lVar7 + 1) {
      pIVar8 = pIVar1 + lVar7 + 1;
    }
    lVar9 = (long)pIVar8 + (-0x14 - (long)pIVar1);
    auVar25 = vbroadcastss_avx512f(auVar18);
    uVar13 = (ulong)(lVar9 != lVar7 * 0x14);
    uVar14 = col0 >> 0x10 & 0xff;
    auVar17._0_4_ = (float)uVar14;
    auVar39._4_12_ = in_ZMM6._4_12_;
    auVar17._4_12_ = auVar39._4_12_;
    auVar43._0_4_ = (float)(int)((col1 >> 0x10 & 0xff) - uVar14);
    auVar43._4_12_ = auVar39._4_12_;
    uVar14 = col0 >> 8 & 0xff;
    auVar40._0_4_ = (float)(col0 & 0xff);
    auVar40._4_12_ = auVar39._4_12_;
    auVar42._0_4_ = (float)uVar14;
    auVar42._4_12_ = auVar39._4_12_;
    auVar26 = vbroadcastss_avx512f(auVar17);
    auVar41._0_4_ = (float)(int)((col1 >> 8 & 0xff) - uVar14);
    auVar41._4_12_ = auVar39._4_12_;
    auVar39._0_4_ = (float)(int)((col1 & 0xff) - (col0 & 0xff));
    auVar17 = vmovshdup_avx(auVar18);
    auVar27 = vbroadcastss_avx512f(auVar43);
    auVar28 = vbroadcastsd_avx512f(auVar17);
    auVar29 = vbroadcastss_avx512f(auVar40);
    auVar30 = vbroadcastss_avx512f(auVar42);
    auVar31 = vpbroadcastq_avx512f();
    auVar32 = vbroadcastss_avx512f(auVar39);
    auVar33 = vbroadcastss_avx512f(auVar41);
    auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / auVar16._0_4_)));
    uVar10 = 0;
    do {
      auVar35 = vpbroadcastq_avx512f();
      auVar16 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      uVar11 = uVar10 + 0x10;
      auVar36 = vporq_avx512f(auVar35,auVar20);
      auVar35 = vporq_avx512f(auVar35,auVar21);
      uVar4 = vpcmpuq_avx512f(auVar35,auVar31,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar36,auVar31,2);
      bVar6 = (byte)uVar4;
      auVar17 = vpxord_avx512vl(auVar35._0_16_,auVar35._0_16_);
      auVar18 = vpxord_avx512vl(auVar36._0_16_,auVar36._0_16_);
      uVar15 = CONCAT11(bVar6,bVar5);
      auVar35 = vgatherdps_avx512f(*(undefined4 *)((long)&(pIVar12->pos).x + unaff_R14));
      auVar36._0_4_ = (uint)(bVar5 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar17._0_4_;
      bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar2 * auVar35._4_4_ | (uint)!bVar2 * auVar17._4_4_;
      bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar2 * auVar35._8_4_ | (uint)!bVar2 * auVar17._8_4_;
      bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar2 * auVar35._12_4_ | (uint)!bVar2 * auVar17._12_4_;
      auVar36._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar35._16_4_;
      auVar36._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar35._20_4_;
      auVar36._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar35._24_4_;
      auVar36._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar35._28_4_;
      auVar36._32_4_ = (uint)(bVar6 & 1) * auVar35._32_4_;
      auVar36._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar35._36_4_;
      auVar36._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar35._40_4_;
      auVar36._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar35._44_4_;
      auVar36._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar35._48_4_;
      auVar36._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar35._52_4_;
      auVar36._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar35._56_4_;
      auVar36._60_4_ = (uint)(bVar6 >> 7) * auVar35._60_4_;
      auVar35 = vgatherdps_avx512f(*(undefined4 *)((long)&(pIVar12->pos).y + unaff_R14));
      auVar38._0_4_ = (uint)(bVar5 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar2 * auVar35._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar2 * auVar35._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar2 * auVar35._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      auVar38._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar35._16_4_;
      auVar38._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar35._20_4_;
      auVar38._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar35._24_4_;
      auVar38._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar35._28_4_;
      auVar38._32_4_ = (uint)(bVar6 & 1) * auVar35._32_4_;
      auVar38._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar35._36_4_;
      auVar38._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar35._40_4_;
      auVar38._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar35._44_4_;
      auVar38._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar35._48_4_;
      auVar38._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar35._52_4_;
      auVar38._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar35._56_4_;
      auVar38._60_4_ = (uint)(bVar6 >> 7) * auVar35._60_4_;
      auVar35 = vsubps_avx512f(auVar36,auVar25);
      auVar36 = vsubps_avx512f(auVar38,auVar28);
      auVar36 = vmulps_avx512f(auVar23,auVar36);
      auVar35 = vfmadd231ps_avx512f(auVar36,auVar24,auVar35);
      auVar35 = vmulps_avx512f(auVar34,auVar35);
      uVar3 = vcmpps_avx512f(auVar35,ZEXT1664(ZEXT816(0) << 0x40),5);
      auVar36 = vminps_avx512f(auVar19,auVar35);
      auVar35._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar36._4_4_;
      auVar35._0_4_ = (uint)((byte)uVar3 & 1) * auVar36._0_4_;
      auVar35._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar36._8_4_;
      auVar35._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar36._12_4_;
      auVar35._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar36._16_4_;
      auVar35._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar36._20_4_;
      auVar35._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar36._24_4_;
      auVar35._28_4_ = (uint)((byte)(uVar3 >> 7) & 1) * auVar36._28_4_;
      auVar35._32_4_ = (uint)((byte)(uVar3 >> 8) & 1) * auVar36._32_4_;
      auVar35._36_4_ = (uint)((byte)(uVar3 >> 9) & 1) * auVar36._36_4_;
      auVar35._40_4_ = (uint)((byte)(uVar3 >> 10) & 1) * auVar36._40_4_;
      auVar35._44_4_ = (uint)((byte)(uVar3 >> 0xb) & 1) * auVar36._44_4_;
      auVar35._48_4_ = (uint)((byte)(uVar3 >> 0xc) & 1) * auVar36._48_4_;
      auVar35._52_4_ = (uint)((byte)(uVar3 >> 0xd) & 1) * auVar36._52_4_;
      auVar35._56_4_ = (uint)((byte)(uVar3 >> 0xe) & 1) * auVar36._56_4_;
      auVar35._60_4_ = (uint)(byte)(uVar3 >> 0xf) * auVar36._60_4_;
      auVar36 = vpgatherdd_avx512f(*(undefined4 *)((long)&pIVar12->col + uVar10));
      auVar37._0_4_ = (uint)(bVar5 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar16._0_4_;
      bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar37._4_4_ = (uint)bVar2 * auVar36._4_4_ | (uint)!bVar2 * auVar16._4_4_;
      bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar37._8_4_ = (uint)bVar2 * auVar36._8_4_ | (uint)!bVar2 * auVar16._8_4_;
      bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar37._12_4_ = (uint)bVar2 * auVar36._12_4_ | (uint)!bVar2 * auVar16._12_4_;
      auVar37._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar36._16_4_;
      auVar37._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar36._20_4_;
      auVar37._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar36._24_4_;
      auVar37._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar36._28_4_;
      auVar37._32_4_ = (uint)(bVar6 & 1) * auVar36._32_4_;
      auVar37._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar36._36_4_;
      auVar37._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar36._40_4_;
      auVar37._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar36._44_4_;
      auVar37._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar36._48_4_;
      auVar37._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar36._52_4_;
      auVar37._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar36._56_4_;
      auVar37._60_4_ = (uint)(bVar6 >> 7) * auVar36._60_4_;
      auVar36 = vfmadd213ps_avx512f(auVar35,auVar32,auVar29);
      auVar38 = vfmadd213ps_avx512f(auVar35,auVar33,auVar30);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar27,auVar26);
      auVar38 = vcvttps2dq_avx512f(auVar38);
      auVar35 = vcvttps2dq_avx512f(auVar35);
      auVar36 = vcvttps2dq_avx512f(auVar36);
      auVar38 = vpslld_avx512f(auVar38,8);
      auVar35 = vpslld_avx512f(auVar35,0x10);
      auVar36 = vpternlogd_avx512f(auVar37,auVar36,auVar22,0xec);
      in_ZMM22 = vpternlogd_avx512f(auVar36,auVar35,auVar38,0xfe);
      vpscatterdd_avx512f(ZEXT864(pIVar12) + auVar31,(ulong)uVar15,in_ZMM22);
      pIVar12 = pIVar12 + 0x10;
      uVar10 = uVar11;
    } while ((((lVar9 - uVar13) + lVar7 * -0x14) / 0x14 + 0x10 + uVar13 & 0xfffffffffffffff0) !=
             uVar11);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    const int col0_r = (int)(col0 >> IM_COL32_R_SHIFT) & 0xFF;
    const int col0_g = (int)(col0 >> IM_COL32_G_SHIFT) & 0xFF;
    const int col0_b = (int)(col0 >> IM_COL32_B_SHIFT) & 0xFF;
    const int col_delta_r = ((int)(col1 >> IM_COL32_R_SHIFT) & 0xFF) - col0_r;
    const int col_delta_g = ((int)(col1 >> IM_COL32_G_SHIFT) & 0xFF) - col0_g;
    const int col_delta_b = ((int)(col1 >> IM_COL32_B_SHIFT) & 0xFF) - col0_b;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = (int)(col0_r + col_delta_r * t);
        int g = (int)(col0_g + col_delta_g * t);
        int b = (int)(col0_b + col_delta_b * t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}